

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japancal.cpp
# Opt level: O3

UBool japanese_calendar_cleanup(void)

{
  EraRules *this;
  void *in_RSI;
  
  this = gJapaneseEraRules;
  if (gJapaneseEraRules != (EraRules *)0x0) {
    icu_63::EraRules::~EraRules(gJapaneseEraRules);
    icu_63::UMemory::operator_delete((UMemory *)this,in_RSI);
    gJapaneseEraRules = (EraRules *)0x0;
  }
  gCurrentEra = 0;
  LOCK();
  gJapaneseEraRulesInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  return '\x01';
}

Assistant:

U_CDECL_BEGIN
static UBool japanese_calendar_cleanup(void) {
    if (gJapaneseEraRules) {
        delete gJapaneseEraRules;
        gJapaneseEraRules = nullptr;
    }
    gCurrentEra = 0;
    gJapaneseEraRulesInitOnce.reset();
    return TRUE;
}